

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

void __thiscall
type_safe::
basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>::
value(basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
      *this)

{
  source_location local_10;
  
  local_10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/variant.hpp"
  ;
  local_10.line_number = 0x158;
  if ((this->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
      .value_ == 0) {
    return;
  }
  debug_assert::default_handler::handle(&local_10,"!has_value()",(char *)0x0);
  abort();
}

Assistant:

nullvar_t value(variant_type<nullvar_t>) const noexcept
    {
        DEBUG_ASSERT(!has_value(), detail::precondition_error_handler{});
        return nullvar;
    }